

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O2

void test_EbGb(PDISASM pMyDisasm)

{
  REGISTERTYPE *pRVar1;
  Int64 *pIVar2;
  UInt8 UVar3;
  UInt8 UVar4;
  UInt8 UVar5;
  UInt8 UVar6;
  UInt8 UVar7;
  UInt8 UVar8;
  UInt8 UVar9;
  
  (pMyDisasm->Instruction).Category = 0x10005;
  builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"test",5);
  (pMyDisasm->Operand1).AccessMode = 1;
  EbGb(pMyDisasm);
  pRVar1 = &(pMyDisasm->Instruction).ImplicitModifiedRegs;
  *(byte *)&pRVar1->type = (byte)pRVar1->type | 0x20;
  pIVar2 = &(pMyDisasm->Instruction).ImplicitModifiedRegs.special;
  *(byte *)pIVar2 = (byte)*pIVar2 | 1;
  UVar3 = EFLAGS_TABLE[0x68].SF_;
  UVar4 = EFLAGS_TABLE[0x68].ZF_;
  UVar5 = EFLAGS_TABLE[0x68].AF_;
  UVar6 = EFLAGS_TABLE[0x68].PF_;
  UVar7 = EFLAGS_TABLE[0x68].CF_;
  UVar8 = EFLAGS_TABLE[0x68].TF_;
  UVar9 = EFLAGS_TABLE[0x68].IF_;
  (pMyDisasm->Instruction).Flags.OF_ = EFLAGS_TABLE[0x68].OF_;
  (pMyDisasm->Instruction).Flags.SF_ = UVar3;
  (pMyDisasm->Instruction).Flags.ZF_ = UVar4;
  (pMyDisasm->Instruction).Flags.AF_ = UVar5;
  (pMyDisasm->Instruction).Flags.PF_ = UVar6;
  (pMyDisasm->Instruction).Flags.CF_ = UVar7;
  (pMyDisasm->Instruction).Flags.TF_ = UVar8;
  (pMyDisasm->Instruction).Flags.IF_ = UVar9;
  UVar3 = EFLAGS_TABLE[0x68].NT_;
  UVar4 = EFLAGS_TABLE[0x68].RF_;
  UVar5 = EFLAGS_TABLE[0x68].alignment;
  (pMyDisasm->Instruction).Flags.DF_ = EFLAGS_TABLE[0x68].DF_;
  (pMyDisasm->Instruction).Flags.NT_ = UVar3;
  (pMyDisasm->Instruction).Flags.RF_ = UVar4;
  (pMyDisasm->Instruction).Flags.alignment = UVar5;
  return;
}

Assistant:

void __bea_callspec__ test_EbGb(PDISASM pMyDisasm)
{
  pMyDisasm->Instruction.Category = GENERAL_PURPOSE_INSTRUCTION+BIT_UInt8;
  #ifndef BEA_LIGHT_DISASSEMBLY
     (void) strcpy (pMyDisasm->Instruction.Mnemonic, "test");
  #endif
  pMyDisasm->Operand1.AccessMode = READ;
  EbGb(pMyDisasm);
  FillFlags(pMyDisasm,104);
}